

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_get_string_value_should_get_a_string(void)

{
  cJSON *item;
  cJSON *item_00;
  char *pcVar1;
  
  item = cJSON_CreateString("test");
  item_00 = cJSON_CreateNumber(1.0);
  if ((item == (cJSON *)0x0) || ((char)item->type != '\x10')) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = item->valuestring;
  }
  if (pcVar1 != item->valuestring) {
    UnityFail(" Expected TRUE Was FALSE",0x1e3);
  }
  if (((item_00 != (cJSON *)0x0) && ((char)item_00->type == '\x10')) &&
     (item_00->valuestring != (char *)0x0)) {
    UnityFail(" Expected NULL",0x1e4);
  }
  cJSON_Delete(item_00);
  cJSON_Delete(item);
  return;
}

Assistant:

static void cjson_get_string_value_should_get_a_string(void)
{
    cJSON *string = cJSON_CreateString("test");
    cJSON *number = cJSON_CreateNumber(1);

    TEST_ASSERT_TRUE(cJSON_GetStringValue(string) == string->valuestring);
    TEST_ASSERT_NULL(cJSON_GetStringValue(number));
    TEST_ASSERT_NULL(cJSON_GetStringValue(NULL));

    cJSON_Delete(number);
    cJSON_Delete(string);
}